

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::load_s_motion_refs_1(xr_ogf_v4 *this,xr_reader *r)

{
  string *psVar1;
  byte *pbVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  psVar1 = &(this->super_xr_ogf).super_xr_object.m_motion_refs;
  uVar4 = (ulong)*puVar3;
  while (uVar5 = uVar4 - 1, uVar4 != 0) {
    xr_reader::skip_sz(r);
    std::__cxx11::string::append((char *)psVar1);
    bVar6 = uVar4 != 1;
    uVar4 = uVar5;
    if (bVar6) {
      std::__cxx11::string::push_back((char)psVar1);
    }
  }
  pbVar2 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 3);
  *pbVar2 = *pbVar2 | 1;
  return;
}

Assistant:

inline void xr_ogf_v4::load_s_motion_refs_1(xr_reader& r)
{
	for (uint_fast32_t n = r.r_u32(); n > 0;) {
		m_motion_refs += r.skip_sz();
		if (--n)
			m_motion_refs += ',';
	}
	set_chunk_loaded(OGF4_S_MOTION_REFS_1);
}